

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stair_shuffle.c
# Opt level: O1

void map_dungeon(dungeon_map *map,uint8_t x,uint8_t y,BOOL have_keys)

{
  byte bVar1;
  long lVar2;
  dw_warp *pdVar3;
  dw_warp *pdVar4;
  uint8_t uVar5;
  uint8_t uVar6;
  undefined7 in_register_00000031;
  dungeon_map *pdVar7;
  
LAB_0016933c:
  if (((map != (dungeon_map *)0x0) && (x < map->width)) && (y < map->height)) {
    lVar2 = (ulong)(uint)((int)CONCAT71(in_register_00000031,x) << 5) +
            (CONCAT71(in_register_00000031,x) & 0xffffffff) * -2 + 3;
    bVar1 = *(byte *)((long)map + (ulong)y + lVar2);
    if ((bVar1 & 8) == 0) {
      if (bVar1 == 5) {
        if (have_keys == FALSE) {
          return;
        }
      }
      else {
        if (bVar1 == 0) {
          return;
        }
        if (bVar1 == 6) {
          return;
        }
      }
      *(byte *)((long)map + (ulong)y + lVar2) = bVar1 | 8;
      if (((bVar1 | 10) == 0xb) && (uVar6 = warps_to->map, uVar6 != '\0')) {
        pdVar3 = warps_to;
        pdVar4 = warps_from;
        do {
          pdVar7 = maps;
          if (((pdVar4->map == map->index) && (pdVar4->x == x)) && (pdVar4->y == y)) {
            uVar5 = maps->index;
            goto LAB_0016940e;
          }
          if (((uVar6 == map->index) && (pdVar3->x == x)) && (pdVar3->y == y)) {
            uVar6 = maps->index;
            goto LAB_0016942e;
          }
          uVar6 = pdVar3[1].map;
          pdVar3 = pdVar3 + 1;
          pdVar4 = pdVar4 + 1;
        } while (uVar6 != '\0');
      }
      goto LAB_0016945a;
    }
  }
  return;
LAB_0016940e:
  pdVar4 = pdVar3;
  if (uVar5 == '\0') goto LAB_00169449;
  if (uVar5 == uVar6) goto LAB_0016944b;
  uVar5 = pdVar7[1].index;
  pdVar7 = pdVar7 + 1;
  goto LAB_0016940e;
LAB_0016942e:
  if (uVar6 == '\0') goto LAB_00169449;
  if (uVar6 == pdVar4->map) goto LAB_0016944b;
  uVar6 = pdVar7[1].index;
  pdVar7 = pdVar7 + 1;
  goto LAB_0016942e;
LAB_00169449:
  pdVar7 = (dungeon_map *)0x0;
LAB_0016944b:
  map_dungeon(pdVar7,pdVar4->x,pdVar4->y,have_keys);
LAB_0016945a:
  map_dungeon(map,x + 0xff,y,have_keys);
  map_dungeon(map,x + '\x01',y,have_keys);
  map_dungeon(map,x,y - 1,have_keys);
  y = y + 1;
  goto LAB_0016933c;
}

Assistant:

static void map_dungeon(dungeon_map *map, uint8_t x, uint8_t y, BOOL have_keys)
{
    dw_warp warp;

    if (!map)
        return;

    if (map_ob(map, x, y))
        return;

    if (map->tiles[x][y] & 0x8)
        return;

    if (!tile_is_walkable(map->tiles[x][y], have_keys))
        return;

    map->tiles[x][y] |= 0x8;
    if (map->tiles[x][y] == (DUNGEON_TILE_STAIRS_UP | 0x8) ||
        map->tiles[x][y] == (DUNGEON_TILE_STAIRS_DOWN | 0x8)) {
        follow_warp(map, x, y, have_keys);
    }
    map_dungeon(map, x-1, y, have_keys);
    map_dungeon(map, x+1, y, have_keys);
    map_dungeon(map, x, y-1, have_keys);
    map_dungeon(map, x, y+1, have_keys);


}